

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

double deqp::gles31::Functional::ldexp(double __x,int __exponent)

{
  bool bVar1;
  int iVar2;
  int sign;
  int iVar3;
  StorageType_conflict mantissa;
  size_t *in_RCX;
  uchar *extraout_RDX;
  uchar *sig;
  uchar *sig_00;
  EVP_PKEY_CTX *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  int local_20;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  Float<unsigned_int,_8,_23,_127,_3U> local_18;
  int local_14;
  Float32 mant;
  int exponent_local;
  float significand_local;
  
  mant.m_value = SUB84(__x,0);
  local_14 = __exponent;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_18,(float)mant.m_value);
  sig_00 = extraout_RDX;
  if ((local_14 == 0) &&
     (bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isZero(&local_18), sig_00 = sig, bVar1)) {
    iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_18,in_RSI,sig,in_RCX,in_R8,in_R9);
    local_20 = -0x80000000;
    if (-1 < iVar2) {
      local_20 = 0;
    }
    exponent_local = local_20;
  }
  else {
    sign = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign
                     (&local_18,in_RSI,sig_00,in_RCX,in_R8,in_R9);
    iVar2 = local_14;
    iVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_18);
    mantissa = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&local_18);
    local_1c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(sign,iVar2 + iVar3,mantissa);
    exponent_local = (int)tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_1c);
  }
  return (double)(ulong)(uint)exponent_local;
}

Assistant:

static inline float ldexp (float significand, int exponent)
{
	const tcu::Float32 mant(significand);

	if (exponent == 0 && mant.isZero())
	{
		return mant.sign() < 0 ? -0.0f : 0.0f;
	}
	else
	{
		return tcu::Float32::construct(mant.sign(), exponent+mant.exponent(), mant.mantissa()).asFloat();
	}
}